

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

Vec_Ptr_t * Ptr_AbcDeriveNtk(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  char *Entry;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *vNtk;
  Abc_Ntk_t *pNtk_local;
  
  p = Vec_PtrAllocExact(5);
  Entry = Abc_NtkName(pNtk);
  Vec_PtrPush(p,Entry);
  pVVar2 = Ptr_AbcDeriveInputs(pNtk);
  Vec_PtrPush(p,pVVar2);
  pVVar2 = Ptr_AbcDeriveOutputs(pNtk);
  Vec_PtrPush(p,pVVar2);
  pVVar2 = Vec_PtrAllocExact(0);
  Vec_PtrPush(p,pVVar2);
  pVVar2 = Ptr_AbcDeriveBoxes(pNtk);
  Vec_PtrPush(p,pVVar2);
  iVar1 = Ptr_CheckArray(p);
  if (iVar1 != 0) {
    return p;
  }
  __assert_fail("Ptr_CheckArray(vNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                ,0xbf,"Vec_Ptr_t *Ptr_AbcDeriveNtk(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveNtk( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNtk = Vec_PtrAllocExact( 5 );
    Vec_PtrPush( vNtk, Abc_NtkName(pNtk) );
    Vec_PtrPush( vNtk, Ptr_AbcDeriveInputs(pNtk) );
    Vec_PtrPush( vNtk, Ptr_AbcDeriveOutputs(pNtk) );
    Vec_PtrPush( vNtk, Vec_PtrAllocExact(0) );
    Vec_PtrPush( vNtk, Ptr_AbcDeriveBoxes(pNtk) );
    assert( Ptr_CheckArray(vNtk) );
    return vNtk;
}